

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_mat * rf_mat_invert(rf_mat mat)

{
  rf_mat *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float in_stack_00000008;
  float in_stack_0000000c;
  float in_stack_00000010;
  float in_stack_00000014;
  float in_stack_00000018;
  float in_stack_0000001c;
  float in_stack_00000020;
  float in_stack_00000024;
  float in_stack_00000028;
  float in_stack_0000002c;
  
  in_RDI->m3 = 0.0;
  in_RDI->m7 = 0.0;
  in_RDI->m11 = 0.0;
  in_RDI->m15 = 0.0;
  in_RDI->m2 = 0.0;
  in_RDI->m6 = 0.0;
  in_RDI->m10 = 0.0;
  in_RDI->m14 = 0.0;
  in_RDI->m1 = 0.0;
  in_RDI->m5 = 0.0;
  in_RDI->m9 = 0.0;
  in_RDI->m13 = 0.0;
  in_RDI->m0 = 0.0;
  in_RDI->m4 = 0.0;
  in_RDI->m8 = 0.0;
  in_RDI->m12 = 0.0;
  fVar13 = in_stack_00000008 * in_stack_0000001c - in_stack_0000000c * in_stack_00000018;
  fVar10 = in_stack_00000008 * mat.m12 - in_stack_0000000c * mat.m8;
  fVar7 = in_stack_00000018 * in_stack_0000002c - in_stack_0000001c * in_stack_00000028;
  fVar6 = in_stack_00000018 * mat.m12 - in_stack_0000001c * mat.m8;
  fVar8 = in_stack_00000010 * mat.m4 - in_stack_00000014 * mat.m0;
  fVar3 = in_stack_00000010 * mat.m5 - in_stack_00000014 * mat.m1;
  fVar11 = in_stack_00000020 * mat.m4 - in_stack_00000024 * mat.m0;
  fVar9 = in_stack_00000020 * mat.m5 - in_stack_00000024 * mat.m1;
  fVar4 = mat.m0 * mat.m5 - mat.m4 * mat.m1;
  fVar12 = in_stack_00000008 * in_stack_0000002c - in_stack_0000000c * in_stack_00000028;
  fVar5 = in_stack_00000028 * mat.m12 - in_stack_0000002c * mat.m8;
  fVar2 = in_stack_00000010 * in_stack_00000024 - in_stack_00000014 * in_stack_00000020;
  fVar1 = 1.0 / (fVar5 * fVar2 +
                ((fVar7 * fVar3 + fVar10 * fVar11 + (fVar13 * fVar4 - fVar9 * fVar12)) -
                fVar6 * fVar8));
  in_RDI->m0 = (mat.m12 * fVar11 + (in_stack_0000001c * fVar4 - fVar9 * in_stack_0000002c)) * fVar1;
  in_RDI->m1 = ((in_stack_00000028 * fVar9 - in_stack_00000018 * fVar4) - mat.m8 * fVar11) * fVar1;
  in_RDI->m2 = (mat.m5 * fVar7 + (in_stack_00000024 * fVar5 - fVar6 * mat.m4)) * fVar1;
  in_RDI->m3 = ((fVar6 * mat.m0 - in_stack_00000020 * fVar5) - mat.m1 * fVar7) * fVar1;
  in_RDI->m4 = ((in_stack_0000002c * fVar3 - in_stack_0000000c * fVar4) - mat.m12 * fVar8) * fVar1;
  in_RDI->m5 = (mat.m8 * fVar8 + (fVar4 * in_stack_00000008 - fVar3 * in_stack_00000028)) * fVar1;
  in_RDI->m6 = ((fVar10 * mat.m4 - in_stack_00000014 * fVar5) - mat.m5 * fVar12) * fVar1;
  in_RDI->m7 = (mat.m1 * fVar12 + (fVar5 * in_stack_00000010 - fVar10 * mat.m0)) * fVar1;
  in_RDI->m8 = (mat.m12 * fVar2 + (in_stack_0000000c * fVar9 - fVar3 * in_stack_0000001c)) * fVar1;
  in_RDI->m9 = ((in_stack_00000018 * fVar3 - fVar9 * in_stack_00000008) - mat.m8 * fVar2) * fVar1;
  in_RDI->m10 = (mat.m5 * fVar13 + (in_stack_00000014 * fVar6 - fVar10 * in_stack_00000024)) * fVar1
  ;
  in_RDI->m11 = ((fVar10 * in_stack_00000020 - fVar6 * in_stack_00000010) - mat.m1 * fVar13) * fVar1
  ;
  in_RDI->m12 = ((in_stack_0000001c * fVar8 - in_stack_0000000c * fVar11) -
                in_stack_0000002c * fVar2) * fVar1;
  in_RDI->m13 = (fVar2 * in_stack_00000028 +
                (fVar11 * in_stack_00000008 - fVar8 * in_stack_00000018)) * fVar1;
  in_RDI->m14 = ((in_stack_00000024 * fVar12 - in_stack_00000014 * fVar7) - mat.m4 * fVar13) * fVar1
  ;
  in_RDI->m15 = (fVar13 * mat.m0 + (fVar7 * in_stack_00000010 - fVar12 * in_stack_00000020)) * fVar1
  ;
  return in_RDI;
}

Assistant:

RF_API rf_mat rf_mat_invert(rf_mat mat)
{
    rf_mat result = {0};

// Cache the matrix values (speed optimization)
    float a00 = mat.m0, a01 = mat.m1, a02 = mat.m2, a03 = mat.m3;
    float a10 = mat.m4, a11 = mat.m5, a12 = mat.m6, a13 = mat.m7;
    float a20 = mat.m8, a21 = mat.m9, a22 = mat.m10, a23 = mat.m11;
    float a30 = mat.m12, a31 = mat.m13, a32 = mat.m14, a33 = mat.m15;

    float b00 = a00 * a11 - a01 * a10;
    float b01 = a00 * a12 - a02 * a10;
    float b02 = a00 * a13 - a03 * a10;
    float b03 = a01 * a12 - a02 * a11;
    float b04 = a01 * a13 - a03 * a11;
    float b05 = a02 * a13 - a03 * a12;
    float b06 = a20 * a31 - a21 * a30;
    float b07 = a20 * a32 - a22 * a30;
    float b08 = a20 * a33 - a23 * a30;
    float b09 = a21 * a32 - a22 * a31;
    float b10 = a21 * a33 - a23 * a31;
    float b11 = a22 * a33 - a23 * a32;

// Calculate the invert determinant (inlined to avoid double-caching)
    float invDet = 1.0f / (b00 * b11 - b01 * b10 + b02 * b09 + b03 * b08 - b04 * b07 + b05 * b06);

    result.m0 = (a11 * b11 - a12 * b10 + a13 * b09) * invDet;
    result.m1 = (-a01 * b11 + a02 * b10 - a03 * b09) * invDet;
    result.m2 = (a31 * b05 - a32 * b04 + a33 * b03) * invDet;
    result.m3 = (-a21 * b05 + a22 * b04 - a23 * b03) * invDet;
    result.m4 = (-a10 * b11 + a12 * b08 - a13 * b07) * invDet;
    result.m5 = (a00 * b11 - a02 * b08 + a03 * b07) * invDet;
    result.m6 = (-a30 * b05 + a32 * b02 - a33 * b01) * invDet;
    result.m7 = (a20 * b05 - a22 * b02 + a23 * b01) * invDet;
    result.m8 = (a10 * b10 - a11 * b08 + a13 * b06) * invDet;
    result.m9 = (-a00 * b10 + a01 * b08 - a03 * b06) * invDet;
    result.m10 = (a30 * b04 - a31 * b02 + a33 * b00) * invDet;
    result.m11 = (-a20 * b04 + a21 * b02 - a23 * b00) * invDet;
    result.m12 = (-a10 * b09 + a11 * b07 - a12 * b06) * invDet;
    result.m13 = (a00 * b09 - a01 * b07 + a02 * b06) * invDet;
    result.m14 = (-a30 * b03 + a31 * b01 - a32 * b00) * invDet;
    result.m15 = (a20 * b03 - a21 * b01 + a22 * b00) * invDet;

    return result;
}